

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O0

char * __thiscall
icu_63::UnicodeKeywordEnumeration::next
          (UnicodeKeywordEnumeration *this,int32_t *resultLength,UErrorCode *status)

{
  UBool UVar1;
  char *pcVar2;
  size_t sVar3;
  char *key;
  char *legacy_key;
  UErrorCode *status_local;
  int32_t *resultLength_local;
  UnicodeKeywordEnumeration *this_local;
  
  pcVar2 = icu_63::KeywordEnumeration::next(&this->super_KeywordEnumeration,(int32_t *)0x0,status);
  UVar1 = ::U_SUCCESS(*status);
  if ((UVar1 != '\0') && (pcVar2 != (char *)0x0)) {
    pcVar2 = uloc_toUnicodeLocaleKey_63(pcVar2);
    if (pcVar2 != (char *)0x0) {
      if (resultLength == (int32_t *)0x0) {
        return pcVar2;
      }
      sVar3 = strlen(pcVar2);
      *resultLength = (int32_t)sVar3;
      return pcVar2;
    }
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  if (resultLength != (int32_t *)0x0) {
    *resultLength = 0;
  }
  return (char *)0x0;
}

Assistant:

virtual const char* next(int32_t* resultLength, UErrorCode& status) {
        const char* legacy_key = KeywordEnumeration::next(nullptr, status);
        if (U_SUCCESS(status) && legacy_key != nullptr) {
            const char* key = uloc_toUnicodeLocaleKey(legacy_key);
            if (key == nullptr) {
                status = U_ILLEGAL_ARGUMENT_ERROR;
            } else {
                if (resultLength != nullptr) {
                    *resultLength = static_cast<int32_t>(uprv_strlen(key));
                }
                return key;
            }
        }
        if (resultLength != nullptr) *resultLength = 0;
        return nullptr;
    }